

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O1

Gia_Man_t * Acec_ManDecla(Gia_Man_t *pGia,int fBooth,int fVerbose)

{
  int iVar1;
  Vec_Bit_t *vIgnore;
  Vec_Int_t *vRes;
  Gia_Man_t *pGVar2;
  long lVar3;
  int level;
  long lVar4;
  Acec_Box_t *pBox;
  timespec ts;
  Acec_Box_t *local_38;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  if (fBooth == 0) {
    vIgnore = (Vec_Bit_t *)0x0;
  }
  else {
    vIgnore = Acec_BoothFindPPG(pGia);
  }
  local_38 = Acec_DeriveBox(pGia,vIgnore,0,0,fVerbose);
  if (vIgnore != (Vec_Bit_t *)0x0) {
    if (vIgnore->pArray != (int *)0x0) {
      free(vIgnore->pArray);
      vIgnore->pArray = (int *)0x0;
    }
    free(vIgnore);
  }
  if (local_38 == (Acec_Box_t *)0x0) {
    puts("Cannot find arithmetic boxes.");
    pGVar2 = Gia_ManDup(pGia);
  }
  else {
    vRes = Acec_RewriteTop(pGia,local_38);
    Acec_BoxFreeP(&local_38);
    pGVar2 = Acec_RewriteReplace(pGia,vRes);
    if (vRes->pArray != (int *)0x0) {
      free(vRes->pArray);
      vRes->pArray = (int *)0x0;
    }
    if (vRes != (Vec_Int_t *)0x0) {
      free(vRes);
    }
    level = 3;
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Acec_ManDecla( Gia_Man_t * pGia, int fBooth, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew = NULL;
    Vec_Bit_t * vIgnore = fBooth ? Acec_BoothFindPPG(pGia) : NULL;
    Acec_Box_t * pBox = Acec_DeriveBox( pGia, vIgnore, 0, 0, fVerbose );
    Vec_Int_t * vResult;
    Vec_BitFreeP( &vIgnore );
    if ( pBox == NULL ) // cannot match
    {
        printf( "Cannot find arithmetic boxes.\n" );
        return Gia_ManDup( pGia );
    }
    vResult = Acec_RewriteTop( pGia, pBox );
    Acec_BoxFreeP( &pBox );
    pNew = Acec_RewriteReplace( pGia, vResult );
    Vec_IntFree( vResult );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return pNew;
}